

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerCheckIsFuncObj(Lowerer *this,Instr *instr,bool checkFuncInfo)

{
  BailOutKind bailOutKind;
  RegOpnd *funcOpnd;
  BailOutInfo *bailOutInfo;
  Instr *this_00;
  AddrOpnd *inlinedFuncInfo;
  undefined7 in_register_00000011;
  Lowerer *pLVar1;
  
  funcOpnd = IR::Opnd::AsRegOpnd(instr->m_src1);
  bailOutKind = IR::Instr::GetBailOutKind(instr);
  pLVar1 = (Lowerer *)instr;
  bailOutInfo = IR::Instr::GetBailOutInfo(instr);
  InsertObjectCheck(pLVar1,funcOpnd,instr,bailOutKind,bailOutInfo);
  this_00 = InsertFunctionTypeIdCheck(pLVar1,funcOpnd,instr,bailOutKind,bailOutInfo);
  if ((int)CONCAT71(in_register_00000011,checkFuncInfo) != 0) {
    pLVar1 = (Lowerer *)instr->m_src2;
    inlinedFuncInfo = IR::Opnd::AsAddrOpnd((Opnd *)pLVar1);
    this_00 = InsertFunctionInfoCheck(pLVar1,funcOpnd,instr,inlinedFuncInfo,bailOutKind,bailOutInfo)
    ;
    IR::Instr::SetByteCodeOffset(this_00,instr);
  }
  if (bailOutInfo->bailOutInstr == instr) {
    bailOutInfo->bailOutInstr = this_00;
  }
  instr->field_0x38 = instr->field_0x38 & 0xaf;
  IR::Instr::Remove(instr);
  return this_00;
}

Assistant:

IR::Instr*
Lowerer::LowerCheckIsFuncObj(IR::Instr *instr, bool checkFuncInfo)
{
    // The CheckIsFuncObj instr and CheckFuncInfo instr (checkFuncInfo = true) are used to
    // generate bailout instrs that type check a function (and can also check the func info).
    // Rather than creating these bailout instrs in Inline, they are created in Lower because 
    // CheckIsFuncObj and CheckFuncInfo instrs can be hoisted outside of loops and thus the
    // bailout instrs created can exist outside of loops.

    IR::RegOpnd *funcOpnd = instr->GetSrc1()->AsRegOpnd();
    IR::BailOutKind bailOutKind = instr->GetBailOutKind();
    BailOutInfo *bailOutInfo = instr->GetBailOutInfo();

    // Check that the property is an object.
    InsertObjectCheck(funcOpnd, instr, bailOutKind, bailOutInfo);

    // Check that the object is a function with the correct type ID.
    IR::Instr *lastInstr = InsertFunctionTypeIdCheck(funcOpnd, instr, bailOutKind, bailOutInfo);

    if (checkFuncInfo)
    {
        // Check that the function body matches the func info.
        lastInstr = InsertFunctionInfoCheck(
            funcOpnd, instr, instr->GetSrc2()->AsAddrOpnd(), bailOutKind, bailOutInfo);
        lastInstr->SetByteCodeOffset(instr);
    }

    if (bailOutInfo->bailOutInstr == instr)
    {
        // bailOutInstr is currently instr. By changing bailOutInstr to point to lastInstr, the next
        // instruction to be lowered (lastInstr) will create the bailout target. This is necessary in
        // cases where instr does not have a shared bailout (ex: instr was not hoisted outside of a loop).
        bailOutInfo->bailOutInstr = lastInstr;
    }

    // the CheckFunctionEntryPoint instr exists in order to create the instrs above. It does not have
    // any other purpose and thus it is removed. The instr's BailOutInfo continues to be used and thus
    // must not be deleted. Flags are turned off to stop Remove() from deleting instr's BailOutInfo.
    instr->hasBailOutInfo = false;
    instr->hasAuxBailOut = false;
    instr->Remove();

    return lastInstr;
}